

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

int __thiscall CaDiCaL::Options::copy(Options *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  
  if (this->arena != 1) {
    *(int *)(dst + 0xc) = this->arena;
  }
  if (this->arenacompact != 1) {
    *(int *)(dst + 0x10) = this->arenacompact;
  }
  if (this->arenasort != 1) {
    *(int *)(dst + 0x14) = this->arenasort;
  }
  if (this->arenatype != 3) {
    *(int *)(dst + 0x18) = this->arenatype;
  }
  if (this->binary != 1) {
    *(int *)(dst + 0x1c) = this->binary;
  }
  if (this->block != 0) {
    *(int *)(dst + 0x20) = this->block;
  }
  if (this->blockmaxclslim != 100000) {
    *(int *)(dst + 0x24) = this->blockmaxclslim;
  }
  if (this->blockminclslim != 2) {
    *(int *)(dst + 0x28) = this->blockminclslim;
  }
  if (this->blockocclim != 100) {
    *(int *)(dst + 0x2c) = this->blockocclim;
  }
  if (this->bump != 1) {
    *(int *)(dst + 0x30) = this->bump;
  }
  if (this->bumpreason != 1) {
    *(int *)(dst + 0x34) = this->bumpreason;
  }
  if (this->bumpreasondepth != 1) {
    *(int *)(dst + 0x38) = this->bumpreasondepth;
  }
  if (this->check != 0) {
    *(int *)(dst + 0x3c) = this->check;
  }
  if (this->checkassumptions != 1) {
    *(int *)(dst + 0x40) = this->checkassumptions;
  }
  if (this->checkconstraint != 1) {
    *(int *)(dst + 0x44) = this->checkconstraint;
  }
  if (this->checkfailed != 1) {
    *(int *)(dst + 0x48) = this->checkfailed;
  }
  if (this->checkfrozen != 0) {
    *(int *)(dst + 0x4c) = this->checkfrozen;
  }
  if (this->checkproof != 3) {
    *(int *)(dst + 0x50) = this->checkproof;
  }
  if (this->checkwitness != 1) {
    *(int *)(dst + 0x54) = this->checkwitness;
  }
  if (this->chrono != 1) {
    *(int *)(dst + 0x58) = this->chrono;
  }
  if (this->chronoalways != 0) {
    *(int *)(dst + 0x5c) = this->chronoalways;
  }
  if (this->chronolevelim != 100) {
    *(int *)(dst + 0x60) = this->chronolevelim;
  }
  if (this->chronoreusetrail != 1) {
    *(int *)(dst + 100) = this->chronoreusetrail;
  }
  if (this->compact != 1) {
    *(int *)(dst + 0x68) = this->compact;
  }
  if (this->compactint != 2000) {
    *(int *)(dst + 0x6c) = this->compactint;
  }
  if (this->compactlim != 100) {
    *(int *)(dst + 0x70) = this->compactlim;
  }
  if (this->compactmin != 100) {
    *(int *)(dst + 0x74) = this->compactmin;
  }
  if (this->condition != 0) {
    *(int *)(dst + 0x78) = this->condition;
  }
  if (this->conditionint != 10000) {
    *(int *)(dst + 0x7c) = this->conditionint;
  }
  if (this->conditionmaxeff != 10000000) {
    *(int *)(dst + 0x80) = this->conditionmaxeff;
  }
  if (this->conditionmaxrat != 100) {
    *(int *)(dst + 0x84) = this->conditionmaxrat;
  }
  if (this->conditionmineff != 1000000) {
    *(int *)(dst + 0x88) = this->conditionmineff;
  }
  if (this->conditionreleff != 100) {
    *(int *)(dst + 0x8c) = this->conditionreleff;
  }
  if (this->cover != 0) {
    *(int *)(dst + 0x90) = this->cover;
  }
  if (this->covermaxclslim != 100000) {
    *(int *)(dst + 0x94) = this->covermaxclslim;
  }
  if (this->covermaxeff != 100000000) {
    *(int *)(dst + 0x98) = this->covermaxeff;
  }
  if (this->coverminclslim != 2) {
    *(int *)(dst + 0x9c) = this->coverminclslim;
  }
  if (this->covermineff != 1000000) {
    *(int *)(dst + 0xa0) = this->covermineff;
  }
  if (this->coverreleff != 4) {
    *(int *)(dst + 0xa4) = this->coverreleff;
  }
  if (this->decompose != 1) {
    *(int *)(dst + 0xa8) = this->decompose;
  }
  if (this->decomposerounds != 2) {
    *(int *)(dst + 0xac) = this->decomposerounds;
  }
  if (this->deduplicate != 1) {
    *(int *)(dst + 0xb0) = this->deduplicate;
  }
  if (this->eagersubsume != 1) {
    *(int *)(dst + 0xb4) = this->eagersubsume;
  }
  if (this->eagersubsumelim != 0x14) {
    *(int *)(dst + 0xb8) = this->eagersubsumelim;
  }
  if (this->elim != 1) {
    *(int *)(dst + 0xbc) = this->elim;
  }
  if (this->elimands != 1) {
    *(int *)(dst + 0xc0) = this->elimands;
  }
  if (this->elimaxeff != 2000000000) {
    *(int *)(dst + 0xc4) = this->elimaxeff;
  }
  if (this->elimbackward != 1) {
    *(int *)(dst + 200) = this->elimbackward;
  }
  if (this->elimboundmax != 0x10) {
    *(int *)(dst + 0xcc) = this->elimboundmax;
  }
  if (this->elimboundmin != 0) {
    *(int *)(dst + 0xd0) = this->elimboundmin;
  }
  if (this->elimclslim != 100) {
    *(int *)(dst + 0xd4) = this->elimclslim;
  }
  if (this->elimequivs != 1) {
    *(int *)(dst + 0xd8) = this->elimequivs;
  }
  if (this->elimineff != 10000000) {
    *(int *)(dst + 0xdc) = this->elimineff;
  }
  if (this->elimint != 2000) {
    *(int *)(dst + 0xe0) = this->elimint;
  }
  if (this->elimites != 1) {
    *(int *)(dst + 0xe4) = this->elimites;
  }
  if (this->elimlimited != 1) {
    *(int *)(dst + 0xe8) = this->elimlimited;
  }
  if (this->elimocclim != 100) {
    *(int *)(dst + 0xec) = this->elimocclim;
  }
  if (this->elimprod != 1) {
    *(int *)(dst + 0xf0) = this->elimprod;
  }
  if (this->elimreleff != 1000) {
    *(int *)(dst + 0xf4) = this->elimreleff;
  }
  if (this->elimrounds != 2) {
    *(int *)(dst + 0xf8) = this->elimrounds;
  }
  if (this->elimsubst != 1) {
    *(int *)(dst + 0xfc) = this->elimsubst;
  }
  if (this->elimsum != 1) {
    *(int *)(dst + 0x100) = this->elimsum;
  }
  if (this->elimxorlim != 5) {
    *(int *)(dst + 0x104) = this->elimxorlim;
  }
  if (this->elimxors != 1) {
    *(int *)(dst + 0x108) = this->elimxors;
  }
  if (this->emagluefast != 0x21) {
    *(int *)(dst + 0x10c) = this->emagluefast;
  }
  if (this->emaglueslow != 100000) {
    *(int *)(dst + 0x110) = this->emaglueslow;
  }
  if (this->emajump != 100000) {
    *(int *)(dst + 0x114) = this->emajump;
  }
  if (this->emalevel != 100000) {
    *(int *)(dst + 0x118) = this->emalevel;
  }
  if (this->emasize != 100000) {
    *(int *)(dst + 0x11c) = this->emasize;
  }
  if (this->ematrailfast != 100) {
    *(int *)(dst + 0x120) = this->ematrailfast;
  }
  if (this->ematrailslow != 100000) {
    *(int *)(dst + 0x124) = this->ematrailslow;
  }
  if (this->exteagerreasons != 1) {
    *(int *)(dst + 0x128) = this->exteagerreasons;
  }
  if (this->exteagerrecalc != 1) {
    *(int *)(dst + 300) = this->exteagerrecalc;
  }
  if (this->externallrat != 0) {
    *(int *)(dst + 0x130) = this->externallrat;
  }
  if (this->flush != 0) {
    *(int *)(dst + 0x134) = this->flush;
  }
  if (this->flushfactor != 3) {
    *(int *)(dst + 0x138) = this->flushfactor;
  }
  if (this->flushint != 100000) {
    *(int *)(dst + 0x13c) = this->flushint;
  }
  if (this->forcephase != 0) {
    *(int *)(dst + 0x140) = this->forcephase;
  }
  if (this->frat != 0) {
    *(int *)(dst + 0x144) = this->frat;
  }
  if (this->idrup != 0) {
    *(int *)(dst + 0x148) = this->idrup;
  }
  if (this->ilb != 0) {
    *(int *)(dst + 0x14c) = this->ilb;
  }
  if (this->ilbassumptions != 0) {
    *(int *)(dst + 0x150) = this->ilbassumptions;
  }
  if (this->inprocessing != 1) {
    *(int *)(dst + 0x154) = this->inprocessing;
  }
  if (this->instantiate != 0) {
    *(int *)(dst + 0x158) = this->instantiate;
  }
  if (this->instantiateclslim != 3) {
    *(int *)(dst + 0x15c) = this->instantiateclslim;
  }
  if (this->instantiateocclim != 1) {
    *(int *)(dst + 0x160) = this->instantiateocclim;
  }
  if (this->instantiateonce != 1) {
    *(int *)(dst + 0x164) = this->instantiateonce;
  }
  if (this->lidrup != 0) {
    *(int *)(dst + 0x168) = this->lidrup;
  }
  if (this->lrat != 0) {
    *(int *)(dst + 0x16c) = this->lrat;
  }
  if (this->lucky != 1) {
    *(int *)(dst + 0x170) = this->lucky;
  }
  if (this->minimize != 1) {
    *(int *)(dst + 0x174) = this->minimize;
  }
  if (this->minimizedepth != 1000) {
    *(int *)(dst + 0x178) = this->minimizedepth;
  }
  if (this->otfs != 1) {
    *(int *)(dst + 0x17c) = this->otfs;
  }
  if (this->phase != 1) {
    *(int *)(dst + 0x180) = this->phase;
  }
  if (this->probe != 1) {
    *(int *)(dst + 0x184) = this->probe;
  }
  if (this->probehbr != 1) {
    *(int *)(dst + 0x188) = this->probehbr;
  }
  if (this->probeint != 5000) {
    *(int *)(dst + 0x18c) = this->probeint;
  }
  if (this->probemaxeff != 100000000) {
    *(int *)(dst + 400) = this->probemaxeff;
  }
  if (this->probemineff != 1000000) {
    *(int *)(dst + 0x194) = this->probemineff;
  }
  if (this->probereleff != 0x14) {
    *(int *)(dst + 0x198) = this->probereleff;
  }
  if (this->proberounds != 1) {
    *(int *)(dst + 0x19c) = this->proberounds;
  }
  if (this->profile != 2) {
    *(int *)(dst + 0x1a0) = this->profile;
  }
  if (this->quiet != 0) {
    *(int *)(dst + 0x1a4) = this->quiet;
  }
  if (this->radixsortlim != 0x20) {
    *(int *)(dst + 0x1a8) = this->radixsortlim;
  }
  if (this->realtime != 0) {
    *(int *)(dst + 0x1ac) = this->realtime;
  }
  if (this->reduce != 1) {
    *(int *)(dst + 0x1b0) = this->reduce;
  }
  if (this->reduceint != 300) {
    *(int *)(dst + 0x1b4) = this->reduceint;
  }
  if (this->reducetarget != 0x4b) {
    *(int *)(dst + 0x1b8) = this->reducetarget;
  }
  if (this->reducetier1glue != 2) {
    *(int *)(dst + 0x1bc) = this->reducetier1glue;
  }
  if (this->reducetier2glue != 6) {
    *(int *)(dst + 0x1c0) = this->reducetier2glue;
  }
  if (this->reluctant != 0x400) {
    *(int *)(dst + 0x1c4) = this->reluctant;
  }
  if (this->reluctantmax != 0x100000) {
    *(int *)(dst + 0x1c8) = this->reluctantmax;
  }
  if (this->rephase != 1) {
    *(int *)(dst + 0x1cc) = this->rephase;
  }
  if (this->rephaseint != 1000) {
    *(int *)(dst + 0x1d0) = this->rephaseint;
  }
  if (this->report != reportdefault) {
    *(int *)(dst + 0x1d4) = this->report;
  }
  if (this->reportall != 0) {
    *(int *)(dst + 0x1d8) = this->reportall;
  }
  if (this->reportsolve != 0) {
    *(int *)(dst + 0x1dc) = this->reportsolve;
  }
  if (this->restart != 1) {
    *(int *)(dst + 0x1e0) = this->restart;
  }
  if (this->restartint != 2) {
    *(int *)(dst + 0x1e4) = this->restartint;
  }
  if (this->restartmargin != 10) {
    *(int *)(dst + 0x1e8) = this->restartmargin;
  }
  if (this->restartreusetrail != 1) {
    *(int *)(dst + 0x1ec) = this->restartreusetrail;
  }
  if (this->restoreall != 0) {
    *(int *)(dst + 0x1f0) = this->restoreall;
  }
  if (this->restoreflush != 0) {
    *(int *)(dst + 500) = this->restoreflush;
  }
  if (this->reverse != 0) {
    *(int *)(dst + 0x1f8) = this->reverse;
  }
  if (this->score != 1) {
    *(int *)(dst + 0x1fc) = this->score;
  }
  if (this->scorefactor != 0x3b6) {
    *(int *)(dst + 0x200) = this->scorefactor;
  }
  if (this->seed != 0) {
    *(int *)(dst + 0x204) = this->seed;
  }
  if (this->shrink != 3) {
    *(int *)(dst + 0x208) = this->shrink;
  }
  if (this->shrinkreap != 1) {
    *(int *)(dst + 0x20c) = this->shrinkreap;
  }
  if (this->shuffle != 0) {
    *(int *)(dst + 0x210) = this->shuffle;
  }
  if (this->shufflequeue != 1) {
    *(int *)(dst + 0x214) = this->shufflequeue;
  }
  if (this->shufflerandom != 0) {
    *(int *)(dst + 0x218) = this->shufflerandom;
  }
  if (this->shufflescores != 1) {
    *(int *)(dst + 0x21c) = this->shufflescores;
  }
  if (this->stabilize != 1) {
    *(int *)(dst + 0x220) = this->stabilize;
  }
  if (this->stabilizefactor != 200) {
    *(int *)(dst + 0x224) = this->stabilizefactor;
  }
  if (this->stabilizeint != 1000) {
    *(int *)(dst + 0x228) = this->stabilizeint;
  }
  if (this->stabilizemaxint != 2000000000) {
    *(int *)(dst + 0x22c) = this->stabilizemaxint;
  }
  if (this->stabilizeonly != 0) {
    *(int *)(dst + 0x230) = this->stabilizeonly;
  }
  if (this->stats != 0) {
    *(int *)(dst + 0x234) = this->stats;
  }
  if (this->subsume != 1) {
    *(int *)(dst + 0x238) = this->subsume;
  }
  if (this->subsumebinlim != 10000) {
    *(int *)(dst + 0x23c) = this->subsumebinlim;
  }
  if (this->subsumeclslim != 100) {
    *(int *)(dst + 0x240) = this->subsumeclslim;
  }
  if (this->subsumeint != 10000) {
    *(int *)(dst + 0x244) = this->subsumeint;
  }
  if (this->subsumelimited != 1) {
    *(int *)(dst + 0x248) = this->subsumelimited;
  }
  if (this->subsumemaxeff != 100000000) {
    *(int *)(dst + 0x24c) = this->subsumemaxeff;
  }
  if (this->subsumemineff != 1000000) {
    *(int *)(dst + 0x250) = this->subsumemineff;
  }
  if (this->subsumeocclim != 100) {
    *(int *)(dst + 0x254) = this->subsumeocclim;
  }
  if (this->subsumereleff != 1000) {
    *(int *)(dst + 600) = this->subsumereleff;
  }
  if (this->subsumestr != 1) {
    *(int *)(dst + 0x25c) = this->subsumestr;
  }
  if (this->target != 1) {
    *(int *)(dst + 0x260) = this->target;
  }
  if (this->terminateint != 10) {
    *(int *)(dst + 0x264) = this->terminateint;
  }
  if (this->ternary != 1) {
    *(int *)(dst + 0x268) = this->ternary;
  }
  if (this->ternarymaxadd != 1000) {
    *(int *)(dst + 0x26c) = this->ternarymaxadd;
  }
  if (this->ternarymaxeff != 100000000) {
    *(int *)(dst + 0x270) = this->ternarymaxeff;
  }
  if (this->ternarymineff != 1000000) {
    *(int *)(dst + 0x274) = this->ternarymineff;
  }
  if (this->ternaryocclim != 100) {
    *(int *)(dst + 0x278) = this->ternaryocclim;
  }
  if (this->ternaryreleff != 10) {
    *(int *)(dst + 0x27c) = this->ternaryreleff;
  }
  if (this->ternaryrounds != 2) {
    *(int *)(dst + 0x280) = this->ternaryrounds;
  }
  if (this->transred != 1) {
    *(int *)(dst + 0x284) = this->transred;
  }
  if (this->transredmaxeff != 100000000) {
    *(int *)(dst + 0x288) = this->transredmaxeff;
  }
  if (this->transredmineff != 1000000) {
    *(int *)(dst + 0x28c) = this->transredmineff;
  }
  if (this->transredreleff != 100) {
    *(int *)(dst + 0x290) = this->transredreleff;
  }
  if (this->verbose != 0) {
    *(int *)(dst + 0x294) = this->verbose;
  }
  if (this->veripb != 0) {
    *(int *)(dst + 0x298) = this->veripb;
  }
  if (this->vivify != 1) {
    *(int *)(dst + 0x29c) = this->vivify;
  }
  if (this->vivifyinst != 1) {
    *(int *)(dst + 0x2a0) = this->vivifyinst;
  }
  if (this->vivifymaxeff != 20000000) {
    *(int *)(dst + 0x2a4) = this->vivifymaxeff;
  }
  if (this->vivifymineff != 20000) {
    *(int *)(dst + 0x2a8) = this->vivifymineff;
  }
  if (this->vivifyonce != 0) {
    *(int *)(dst + 0x2ac) = this->vivifyonce;
  }
  if (this->vivifyredeff != 0x4b) {
    *(int *)(dst + 0x2b0) = this->vivifyredeff;
  }
  if (this->vivifyreleff != 0x14) {
    *(int *)(dst + 0x2b4) = this->vivifyreleff;
  }
  if (this->walk != 1) {
    *(int *)(dst + 0x2b8) = this->walk;
  }
  if (this->walkmaxeff != 10000000) {
    *(int *)(dst + 700) = this->walkmaxeff;
  }
  if (this->walkmineff != 100000) {
    *(int *)(dst + 0x2c0) = this->walkmineff;
  }
  if (this->walknonstable != 1) {
    *(int *)(dst + 0x2c4) = this->walknonstable;
  }
  if (this->walkredundant != 0) {
    *(int *)(dst + 0x2c8) = this->walkredundant;
  }
  iVar1 = this->walkreleff;
  if (iVar1 != 0x14) {
    *(int *)(dst + 0x2cc) = iVar1;
  }
  return iVar1;
}

Assistant:

void Options::copy (Options &other) const {
#ifdef LOGGING
  Internal *internal = other.internal;
#endif
#define OPTION(N, V, L, H, O, P, R, D) \
  if ((N) == (int) (V)) \
    LOG ("keeping non default option '--%s=%s'", #N, #V); \
  else if ((N) != (int) (V)) { \
    LOG ("overwriting default option by '--%s=%d'", #N, N); \
    other.N = N; \
  }
  OPTIONS
#undef OPTION
}